

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

TestCase * __thiscall doctest::detail::TestCase::operator=(TestCase *this,TestCase *other)

{
  String *this_00;
  
  TestCaseData::operator=(&this->super_TestCaseData,&other->super_TestCaseData);
  this->m_test = other->m_test;
  String::operator=(&this->m_type,&other->m_type);
  this->m_template_id = other->m_template_id;
  this_00 = &this->m_full_name;
  String::operator=(this_00,&other->m_full_name);
  if (this->m_template_id != -1) {
    if ((this->m_full_name).field_0.buf[0x17] < '\0') {
      this_00 = (String *)(this->m_full_name).field_0.data.ptr;
    }
    (this->super_TestCaseData).m_name = (char *)this_00;
  }
  return this;
}

Assistant:

TestCase& TestCase::operator=(const TestCase& other) {
        TestCaseData::operator=(other);
        m_test        = other.m_test;
        m_type        = other.m_type;
        m_template_id = other.m_template_id;
        m_full_name   = other.m_full_name;

        if(m_template_id != -1)
            m_name = m_full_name.c_str();
        return *this;
    }